

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  bool bVar2;
  ImGuiContext *pIVar3;
  undefined4 uVar4;
  ImU32 col;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiCol local_114;
  bool local_f5;
  float local_f4;
  float local_f0;
  float local_ec;
  ImRect local_e4;
  ImRect local_d4;
  undefined1 local_c4 [8];
  ImRect grab_rect;
  ImU32 grab_col;
  float scroll_v_norm;
  bool seek_absolute;
  float clicked_v_norm;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  float scroll_max;
  bool hovered;
  float fStack_88;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  float win_size_v;
  float scrollbar_size_v;
  undefined1 local_74 [8];
  ImRect bb;
  bool horizontal;
  bool allow_interaction;
  ImGuiStyle *style;
  float alpha;
  float bb_frame_height;
  float bb_frame_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImDrawCornerFlags rounding_corners_local;
  float size_contents_v_local;
  float size_avail_v_local;
  float *p_scroll_v_local;
  ImGuiAxis axis_local;
  ImGuiID id_local;
  ImRect *bb_frame_local;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    fVar5 = ImRect::GetWidth(bb_frame);
    fVar6 = ImRect::GetHeight(bb_frame);
    if ((fVar5 <= 0.0) || (fVar6 <= 0.0)) {
      bb_frame_local._7_1_ = false;
    }
    else {
      style._4_4_ = 1.0;
      if ((axis == ImGuiAxis_Y) &&
         (fVar7 = (pIVar3->Style).FramePadding.y, fVar6 < fVar7 + fVar7 + pIVar3->FontSize)) {
        style._4_4_ = ImSaturate((fVar6 - pIVar3->FontSize) / ((pIVar3->Style).FramePadding.y * 2.0)
                                );
      }
      if (0.0 < style._4_4_) {
        register0x00000000 = &pIVar3->Style;
        bb.Max.x._3_1_ = 1.0 <= style._4_4_;
        bb.Max.x._2_1_ = axis == ImGuiAxis_X;
        local_74 = *(undefined1 (*) [8])&bb_frame->Min;
        bb.Min = bb_frame->Max;
        fVar5 = ImClamp<float>((float)(int)((fVar5 - 2.0) * 0.5),0.0,3.0);
        fVar6 = ImClamp<float>((float)(int)((fVar6 - 2.0) * 0.5),0.0,3.0);
        ImVec2::ImVec2((ImVec2 *)&win_size_v,-fVar5,-fVar6);
        ImRect::Expand((ImRect *)local_74,(ImVec2 *)&win_size_v);
        if ((bb.Max.x._2_1_ & 1) == 0) {
          local_ec = ImRect::GetHeight((ImRect *)local_74);
        }
        else {
          local_ec = ImRect::GetWidth((ImRect *)local_74);
        }
        grab_h_pixels = local_ec;
        fVar5 = ImMax<float>(size_contents_v,size_avail_v);
        if (fVar5 <= 0.0) {
          __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                        ,0x354,
                        "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                       );
        }
        fVar5 = ImMax<float>(size_contents_v,size_avail_v);
        grab_h_norm = ImMax<float>(fVar5,1.0);
        fStack_88 = ImClamp<float>(grab_h_pixels * (size_avail_v / grab_h_norm),
                                   stack0xffffffffffffffa0->GrabMinSize,grab_h_pixels);
        scroll_max = fStack_88 / grab_h_pixels;
        scroll_ratio._3_1_ = 0;
        scroll_ratio._2_1_ = 0;
        ButtonBehavior((ImRect *)local_74,id,(bool *)((long)&scroll_ratio + 2),
                       (bool *)((long)&scroll_ratio + 3),0x4000);
        fVar5 = ImMax<float>(1.0,size_contents_v - size_avail_v);
        fVar6 = ImSaturate(*p_scroll_v / fVar5);
        mouse_pos_v = (fVar6 * (grab_h_pixels - fStack_88)) / grab_h_pixels;
        if ((((scroll_ratio._3_1_ & 1) != 0) && ((bb.Max.x._3_1_ & 1) != 0)) && (scroll_max < 1.0))
        {
          if ((bb.Max.x._2_1_ & 1) == 0) {
            local_f0 = (float)local_74._4_4_;
          }
          else {
            local_f0 = (float)local_74._0_4_;
          }
          if ((bb.Max.x._2_1_ & 1) == 0) {
            local_f4 = (pIVar3->IO).MousePos.y;
          }
          else {
            local_f4 = (pIVar3->IO).MousePos.x;
          }
          fVar6 = ImSaturate((local_f4 - local_f0) / grab_h_pixels);
          SetHoveredID(id);
          local_f5 = false;
          if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
            bVar2 = mouse_pos_v + scroll_max < fVar6;
            local_f5 = fVar6 < mouse_pos_v || bVar2;
            if (fVar6 < mouse_pos_v || bVar2) {
              pIVar3->ScrollbarClickDeltaToGrabCenter = 0.0;
            }
            else {
              pIVar3->ScrollbarClickDeltaToGrabCenter = -scroll_max * 0.5 + (fVar6 - mouse_pos_v);
            }
          }
          grab_rect.Max.y =
               ImSaturate((-scroll_max * 0.5 + (fVar6 - pIVar3->ScrollbarClickDeltaToGrabCenter)) /
                          (1.0 - scroll_max));
          *p_scroll_v = (float)(int)(grab_rect.Max.y * fVar5 + 0.5);
          fVar5 = ImSaturate(*p_scroll_v / fVar5);
          mouse_pos_v = (fVar5 * (grab_h_pixels - fStack_88)) / grab_h_pixels;
          if (local_f5) {
            pIVar3->ScrollbarClickDeltaToGrabCenter = -scroll_max * 0.5 + (fVar6 - mouse_pos_v);
          }
        }
        this = pIVar1->DrawList;
        col = GetColorU32(0xe,1.0);
        ImDrawList::AddRectFilled
                  (this,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,rounding_corners);
        if ((scroll_ratio._3_1_ & 1) == 0) {
          local_114 = 0xf;
          if ((scroll_ratio._2_1_ & 1) != 0) {
            local_114 = 0x10;
          }
        }
        else {
          local_114 = 0x11;
        }
        grab_rect.Max.x = (float)GetColorU32(local_114,style._4_4_);
        ImRect::ImRect((ImRect *)local_c4);
        uVar4 = local_74._0_4_;
        if ((bb.Max.x._2_1_ & 1) == 0) {
          fVar6 = ImLerp<float>((float)local_74._4_4_,bb.Min.y,mouse_pos_v);
          fVar5 = bb.Min.x;
          fVar7 = ImLerp<float>((float)local_74._4_4_,bb.Min.y,mouse_pos_v);
          ImRect::ImRect(&local_e4,(float)uVar4,fVar6,fVar5,fVar7 + fStack_88);
          local_c4._0_4_ = local_e4.Min.x;
          local_c4._4_4_ = local_e4.Min.y;
          grab_rect.Min = local_e4.Max;
        }
        else {
          fVar5 = ImLerp<float>((float)local_74._0_4_,bb.Min.x,mouse_pos_v);
          uVar4 = local_74._4_4_;
          fVar6 = ImLerp<float>((float)local_74._0_4_,bb.Min.x,mouse_pos_v);
          ImRect::ImRect(&local_d4,fVar5,(float)uVar4,fVar6 + fStack_88,bb.Min.y);
          local_c4._0_4_ = local_d4.Min.x;
          local_c4._4_4_ = local_d4.Min.y;
          grab_rect.Min = local_d4.Max;
        }
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,(ImVec2 *)local_c4,&grab_rect.Min,(ImU32)grab_rect.Max.x,
                   stack0xffffffffffffffa0->ScrollbarRounding,0xf);
        bb_frame_local._7_1_ = (bool)(scroll_ratio._3_1_ & 1);
      }
      else {
        bb_frame_local._7_1_ = false;
      }
    }
  }
  else {
    bb_frame_local._7_1_ = false;
  }
  return bb_frame_local._7_1_;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);
    const bool horizontal = (axis == ImGuiAxis_X);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, rounding_corners);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}